

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.cpp
# Opt level: O3

string * arbiter::drivers::AZ::Config::extractStorageAccount
                   (string *__return_storage_ptr__,string *s)

{
  element_type *peVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  first;
  long *plVar2;
  size_type sVar3;
  const_reference this;
  runtime_error *this_00;
  pointer *__ptr;
  json c;
  element_type *local_a8;
  long *local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [8];
  json_value local_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if (s->_M_string_length == 0) {
    local_78[0] = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                   )0x0;
    local_70.object = (object_t *)0x0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_78);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                        *)local_78);
  }
  else {
    first._M_current = (s->_M_dataplus)._M_p;
    nlohmann::detail::input_adapter::
    input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_0>
              ((input_adapter *)local_98,first,
               (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(first._M_current + s->_M_string_length));
    local_58 = (code *)0x0;
    uStack_50 = 0;
    local_68._M_unused._M_object = (void *)0x0;
    local_68._8_8_ = 0;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::parse((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
             *)local_78,(input_adapter *)local_98,(parser_callback_t *)&local_68,true);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,__destroy_functor);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_98._8_8_);
    }
  }
  if ((local_78[0] ==
       (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
        )0x0) ||
     (sVar3 = nlohmann::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
              ::count<char_const(&)[8]>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                          *)local_78,(char (*) [8])"account"), sVar3 == 0)) {
    peVar1 = (element_type *)(local_98 + 0x10);
    local_98._0_8_ = peVar1;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AZURE_STORAGE_ACCOUNT","")
    ;
    env((arbiter *)&local_a8,(string *)local_98);
    if ((element_type *)local_98._0_8_ != peVar1) {
      operator_delete((void *)local_98._0_8_);
    }
    if (local_a8 == (element_type *)0x0) {
      local_98._0_8_ = peVar1;
      ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"AZ_STORAGE_ACCOUNT","");
      env((arbiter *)&local_a0,(string *)local_98);
      if ((element_type *)local_98._0_8_ != peVar1) {
        operator_delete((void *)local_98._0_8_);
      }
      plVar2 = local_a0;
      if (local_a0 != (long *)0x0) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)__return_storage_ptr__,*local_a0,local_a0[1] + *local_a0);
        if (local_a0 != (long *)0x0) {
          if ((long *)*local_a0 != local_a0 + 2) {
            operator_delete((long *)*local_a0);
          }
          operator_delete(local_a0);
        }
      }
      if (local_a8 != (element_type *)0x0) {
        if ((element_type *)local_a8->_vptr_input_adapter_protocol != local_a8 + 2) {
          operator_delete((element_type *)local_a8->_vptr_input_adapter_protocol);
        }
        operator_delete(local_a8);
      }
      if (plVar2 == (long *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        local_40[0] = local_30;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_40,
                   "Couldn\'t find Azure Storage account value - this is mandatory","");
        ::std::runtime_error::runtime_error(this_00,(string *)local_40);
        *(undefined ***)this_00 = &PTR__runtime_error_001950e8;
        __cxa_throw(this_00,&ArbiterError::typeinfo,::std::runtime_error::~runtime_error);
      }
      goto LAB_00166e29;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_a8->_vptr_input_adapter_protocol,
               (long)local_a8[1]._vptr_input_adapter_protocol +
               (long)local_a8->_vptr_input_adapter_protocol);
    if (local_a8 == (element_type *)0x0) goto LAB_00166e29;
    if ((element_type *)local_a8->_vptr_input_adapter_protocol != local_a8 + 2) {
      operator_delete((element_type *)local_a8->_vptr_input_adapter_protocol);
    }
  }
  else {
    local_98._0_8_ = (element_type *)(local_98 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"account","");
    this = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
           ::at((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                 *)local_78,(key_type *)local_98);
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::
    get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,this);
    local_a8 = (element_type *)local_98._0_8_;
    if ((element_type *)local_98._0_8_ == (element_type *)(local_98 + 0x10)) goto LAB_00166e29;
  }
  operator_delete(local_a8);
LAB_00166e29:
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::assert_invariant((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
                      *)local_78);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::json_value::destroy((json_value *)(local_78 + 8),(value_t)local_78[0]);
  return __return_storage_ptr__;
}

Assistant:

std::string AZ::Config::extractStorageAccount(const std::string s)
{
    const json c(s.size() ? json::parse(s) : json());

    if (!c.is_null() && c.count("account"))
    {
        return c.at("account").get<std::string>();
    }
    else if (auto p = env("AZURE_STORAGE_ACCOUNT"))
    {
        return *p;
    }
    else if (auto p = env("AZ_STORAGE_ACCOUNT"))
    {
        return *p;
    }

   throw ArbiterError("Couldn't find Azure Storage account value - this is mandatory");
}